

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_serialiserscommon.cpp
# Opt level: O2

QAbstractItemModel * __thiscall
tst_SerialiserCommon::createComplexModel
          (tst_SerialiserCommon *this,bool tree,bool multiRoles,QObject *parent)

{
  int iVar1;
  QStandardItemModel *this_00;
  int i;
  int iVar2;
  QArrayDataPointer<char16_t> local_a0;
  QArrayDataPointer<char16_t> local_88;
  anon_union_24_3_e3d07ef4_for_data local_68;
  QArrayDataPointer<char16_t> local_48;
  
  this_00 = (QStandardItemModel *)operator_new(0x10);
  QStandardItemModel::QStandardItemModel(this_00,parent);
  local_68._forAlignment = -NAN;
  local_68._8_8_ = 0;
  local_68._16_8_ = 0;
  insertBranch(this,(QAbstractItemModel *)this_00,(QModelIndex *)&local_68,multiRoles,(uint)tree * 2
              );
  iVar2 = 0;
  while( true ) {
    local_68._forAlignment = -NAN;
    local_68._8_8_ = 0;
    local_68._16_8_ = 0;
    iVar1 = (**(code **)(*(long *)this_00 + 0x78))(this_00,&local_68);
    if (iVar1 <= iVar2) break;
    local_a0.d = (Data *)0x0;
    local_a0.ptr = L"Row %1";
    local_a0.size = 6;
    local_88.d = (Data *)0x0;
    local_88.ptr = (char16_t *)0x0;
    local_88.size = 0;
    QString::arg((QString *)&local_48,(QString *)&local_a0,iVar2,0,10,(QChar)0x20);
    QVariant::QVariant((QVariant *)&local_68,(QString *)&local_48);
    (**(code **)(*(long *)this_00 + 0xa8))(this_00,iVar2,2,&local_68,2);
    QVariant::~QVariant((QVariant *)&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
    if (multiRoles) {
      QVariant::QVariant((QVariant *)&local_68,iVar2);
      (**(code **)(*(long *)this_00 + 0xa8))(this_00,iVar2,2,&local_68,0x100);
      QVariant::~QVariant((QVariant *)&local_68);
    }
    iVar2 = iVar2 + 1;
  }
  iVar2 = 0;
  while( true ) {
    local_68._forAlignment = -NAN;
    local_68._8_8_ = 0;
    local_68._16_8_ = 0;
    iVar1 = (**(code **)(*(long *)this_00 + 0x80))(this_00,&local_68);
    if (iVar1 <= iVar2) break;
    local_a0.d = (Data *)0x0;
    local_a0.ptr = L"Column %1";
    local_a0.size = 9;
    local_88.d = (Data *)0x0;
    local_88.ptr = (char16_t *)0x0;
    local_88.size = 0;
    QString::arg((QString *)&local_48,(QString *)&local_a0,iVar2,0,10,(QChar)0x20);
    QVariant::QVariant((QVariant *)&local_68,(QString *)&local_48);
    (**(code **)(*(long *)this_00 + 0xa8))(this_00,iVar2,1,&local_68,2);
    QVariant::~QVariant((QVariant *)&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
    if (multiRoles) {
      QVariant::QVariant((QVariant *)&local_68,iVar2);
      (**(code **)(*(long *)this_00 + 0xa8))(this_00,iVar2,1,&local_68,0x100);
      QVariant::~QVariant((QVariant *)&local_68);
    }
    iVar2 = iVar2 + 1;
  }
  return (QAbstractItemModel *)this_00;
}

Assistant:

QAbstractItemModel *tst_SerialiserCommon::createComplexModel(bool tree, bool multiRoles, QObject *parent)
{
    ComplexModel *result = new ComplexModel(parent);
    insertBranch(result, QModelIndex(), multiRoles, tree ? 2 : 0);
    for (int i = 0; i < result->rowCount(); ++i) {
        result->setHeaderData(i, Qt::Vertical, QStringLiteral("Row %1").arg(i));
        if (multiRoles)
            result->setHeaderData(i, Qt::Vertical, i, Qt::UserRole);
    }
    for (int i = 0; i < result->columnCount(); ++i) {
        result->setHeaderData(i, Qt::Horizontal, QStringLiteral("Column %1").arg(i));
        if (multiRoles)
            result->setHeaderData(i, Qt::Horizontal, i, Qt::UserRole);
    }
    return result;
}